

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::Initialize(void)

{
  ImGuiContext *pIVar1;
  ImGuiID IVar2;
  char local_59;
  ImGuiViewportP *viewport;
  undefined8 local_50;
  _func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *p_Stack_48;
  _func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *local_40;
  _func_void_ptr_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_char_ptr *p_Stack_38;
  _func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_void_ptr_char_ptr *local_30;
  _func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *p_Stack_28;
  _func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_ImGuiTextBuffer_ptr *local_20;
  void *pvStack_18;
  
  pIVar1 = GImGui;
  local_20 = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_ImGuiTextBuffer_ptr *)0x0;
  pvStack_18 = (void *)0x0;
  local_30 = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_void_ptr_char_ptr *)0x0;
  p_Stack_28 = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
  local_40 = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
  p_Stack_38 = (_func_void_ptr_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_char_ptr *)0x0;
  local_50._0_4_ = 0;
  local_50._4_4_ = 0;
  p_Stack_48 = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
  viewport = (ImGuiViewportP *)0x22ea97;
  IVar2 = ImHashStr("Window",0,0);
  local_50._0_4_ = IVar2;
  p_Stack_48 = WindowSettingsHandler_ClearAll;
  p_Stack_38 = WindowSettingsHandler_ReadOpen;
  local_30 = WindowSettingsHandler_ReadLine;
  p_Stack_28 = WindowSettingsHandler_ApplyAll;
  local_20 = WindowSettingsHandler_WriteAll;
  AddSettingsHandler((ImGuiSettingsHandler *)&viewport);
  TableSettingsAddSettingsHandler();
  LocalizeRegisterEntries(GLocalizationEntriesEnUS,7);
  viewport = (ImGuiViewportP *)MemAlloc(0xb8);
  (viewport->super_ImGuiViewport).Flags = 0;
  (viewport->super_ImGuiViewport).Pos.x = 0.0;
  *(undefined8 *)&(viewport->super_ImGuiViewport).Pos.y = 0;
  *(undefined8 *)&(viewport->super_ImGuiViewport).Size.y = 0;
  *(undefined8 *)&(viewport->super_ImGuiViewport).WorkPos.y = 0;
  *(undefined8 *)&(viewport->super_ImGuiViewport).WorkSize.y = 0;
  (viewport->super_ImGuiViewport).PlatformHandleRaw = (void *)0x0;
  (viewport->DrawDataP).Valid = false;
  *(undefined3 *)&(viewport->DrawDataP).field_0x1 = 0;
  (viewport->DrawDataP).CmdListsCount = 0;
  (viewport->DrawDataP).TotalIdxCount = 0;
  (viewport->DrawDataP).TotalVtxCount = 0;
  (viewport->DrawDataP).CmdLists = (ImDrawList **)0x0;
  (viewport->DrawDataP).DisplayPos.x = 0.0;
  (viewport->DrawDataP).DisplayPos.y = 0.0;
  (viewport->DrawDataP).DisplaySize.x = 0.0;
  (viewport->DrawDataP).DisplaySize.y = 0.0;
  (viewport->DrawDataP).FramebufferScale.x = 0.0;
  (viewport->DrawDataP).FramebufferScale.y = 0.0;
  (viewport->DrawDataBuilder).Layers[0].Size = 0;
  (viewport->DrawDataBuilder).Layers[0].Capacity = 0;
  (viewport->DrawDataBuilder).Layers[0].Data = (ImDrawList **)0x0;
  (viewport->DrawDataBuilder).Layers[1].Size = 0;
  (viewport->DrawDataBuilder).Layers[1].Capacity = 0;
  (viewport->DrawDataBuilder).Layers[1].Data = (ImDrawList **)0x0;
  (viewport->WorkOffsetMin).x = 0.0;
  (viewport->WorkOffsetMin).y = 0.0;
  (viewport->WorkOffsetMax).x = 0.0;
  (viewport->WorkOffsetMax).y = 0.0;
  (viewport->BuildWorkOffsetMin).x = 0.0;
  (viewport->BuildWorkOffsetMin).y = 0.0;
  (viewport->BuildWorkOffsetMax).x = 0.0;
  (viewport->BuildWorkOffsetMax).y = 0.0;
  viewport->DrawListsLastFrame[0] = -1;
  viewport->DrawListsLastFrame[1] = -1;
  viewport->DrawLists[0] = (ImDrawList *)0x0;
  viewport->DrawLists[1] = (ImDrawList *)0x0;
  ImVector<ImGuiViewportP_*>::push_back(&pIVar1->Viewports,&viewport);
  local_59 = '\0';
  ImVector<char>::resize(&pIVar1->TempBuffer,0xc01,&local_59);
  pIVar1->Initialized = true;
  return;
}

Assistant:

void ImGui::Initialize()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(!g.Initialized && !g.SettingsLoaded);

    // Add .ini handle for ImGuiWindow and ImGuiTable types
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Window";
        ini_handler.TypeHash = ImHashStr("Window");
        ini_handler.ClearAllFn = WindowSettingsHandler_ClearAll;
        ini_handler.ReadOpenFn = WindowSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = WindowSettingsHandler_ReadLine;
        ini_handler.ApplyAllFn = WindowSettingsHandler_ApplyAll;
        ini_handler.WriteAllFn = WindowSettingsHandler_WriteAll;
        AddSettingsHandler(&ini_handler);
    }
    TableSettingsAddSettingsHandler();

    // Setup default localization table
    LocalizeRegisterEntries(GLocalizationEntriesEnUS, IM_ARRAYSIZE(GLocalizationEntriesEnUS));

    // Create default viewport
    ImGuiViewportP* viewport = IM_NEW(ImGuiViewportP)();
    g.Viewports.push_back(viewport);
    g.TempBuffer.resize(1024 * 3 + 1, 0);

#ifdef IMGUI_HAS_DOCK
#endif

    g.Initialized = true;
}